

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UnicodeString *text,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  short sVar1;
  char16_t cVar2;
  int iVar3;
  int32_t i;
  int offset;
  
  offset = 0;
  while( true ) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 <= offset) break;
    cVar2 = icu_63::UnicodeString::doCharAt(text,offset);
    appendToRule(rule,(uint)(ushort)cVar2,isLiteral,escapeUnprintable,quoteBuf);
    offset = offset + 1;
  }
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               const UnicodeString& text,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    for (int32_t i=0; i<text.length(); ++i) {
        appendToRule(rule, text[i], isLiteral, escapeUnprintable, quoteBuf);
    }
}